

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_load.cpp
# Opt level: O3

bool __thiscall OPNMIDIplay::LoadBank(OPNMIDIplay *this,FileAndMemReader *fr)

{
  OpnInstMeta *pOVar1;
  OpnInstMeta *pOVar2;
  undefined8 *puVar3;
  ushort uVar4;
  OPN2 *pOVar5;
  WOPNBank *pWVar6;
  undefined1 auVar7 [14];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  OpnTimbre *pOVar13;
  uint16_t uVar14;
  uint uVar15;
  size_t __size;
  void *mem;
  WOPNFile *pWVar16;
  uint8_t *puVar17;
  WOPNBank **ppWVar18;
  char *pcVar19;
  undefined8 extraout_RDX;
  uint8_t *puVar20;
  undefined8 uVar21;
  uint8_t *puVar22;
  long lVar23;
  char *pcVar24;
  long lVar25;
  unsigned_long uVar26;
  ulong uVar27;
  undefined1 auVar28 [15];
  int err;
  int local_281c;
  uint local_2818;
  uint local_2814;
  long local_2810;
  WOPNFile *local_2808;
  OPNMIDIplay *local_2800;
  BasicBankMap<OPN2::Bank> *local_27f8;
  ulong local_27f0;
  WOPNBank *local_27e8;
  WOPNBank *pWStack_27e0;
  pair<BasicBankMap<OPN2::Bank>::iterator,_bool> local_27d8;
  value_type local_27b8;
  
  local_281c = 0;
  if (fr->m_mp == (void *)0x0 && fr->m_fp == (FILE *)0x0) {
    pcVar24 = (char *)(this->errorStringOut)._M_string_length;
    pcVar19 = "Custom bank: Invalid data stream!";
  }
  else {
    __size = FileAndMemReader::fileSize(fr);
    FileAndMemReader::seek(fr,0,0);
    mem = malloc(__size);
    if (mem != (void *)0x0) {
      FileAndMemReader::read(fr,(int)mem,(void *)0x1,__size);
      pWVar16 = WOPN_LoadBankFromMem(mem,__size,&local_281c);
      free(mem);
      if (pWVar16 != (WOPNFile *)0x0) {
        pOVar5 = (this->m_synth).m_p;
        (pOVar5->m_insBankSetup).volumeModel = (uint)pWVar16->volume_model;
        auVar28 = ZEXT215(CONCAT11(pWVar16->lfo_freq,pWVar16->lfo_freq >> 3)) & DAT_001ebd90._0_15_;
        auVar11._8_7_ = 0;
        auVar11._0_8_ = SUB158(ZEXT115(0) << 0x40,7);
        auVar12._10_5_ = 0;
        auVar12._0_10_ = SUB1510(auVar11 << 0x38,5);
        auVar10._1_12_ = SUB1512(auVar12 << 0x28,3);
        auVar10[0] = auVar28[1];
        auVar7._6_8_ = SUB148(ZEXT214(0) << 0x40,6);
        auVar7._4_2_ = auVar10._0_2_;
        auVar7._1_3_ = 0;
        auVar7[0] = auVar28[0];
        (pOVar5->m_insBankSetup).lfoEnable = (int)auVar7._0_8_;
        (pOVar5->m_insBankSetup).lfoFrequency = (int)((ulong)auVar7._0_8_ >> 0x20);
        (pOVar5->m_insBankSetup).chipType = (uint)pWVar16->chip_type;
        (pOVar5->m_insBankSetup).mt32defaults = false;
        (this->m_setup).VolumeModel = 0;
        (this->m_setup).lfoEnable = -1;
        (this->m_setup).lfoFrequency = -1;
        (this->m_setup).chipType = -1;
        local_27f8 = &pOVar5->m_insBanks;
        local_2800 = this;
        BasicBankMap<OPN2::Bank>::clear(local_27f8);
        uVar15._0_2_ = pWVar16->banks_count_melodic;
        uVar15._2_2_ = pWVar16->banks_count_percussion;
        local_27e8 = pWVar16->banks_melodic;
        pWStack_27e0 = pWVar16->banks_percussive;
        local_2818 = uVar15 >> 0x10;
        ppWVar18 = &local_27e8;
        uVar21 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
        local_2810 = 0;
        local_2808 = pWVar16;
        do {
          local_2814 = (uint)uVar21;
          if ((short)uVar15 != 0) {
            local_27f0 = (ulong)(uVar15 & 0xffff);
            pWVar6 = *ppWVar18;
            puVar22 = &pWVar6->ins[0].operators[0].ssgeg_90;
            uVar27 = 0;
            do {
              uVar4._0_1_ = pWVar6[uVar27].bank_midi_lsb;
              uVar4._1_1_ = pWVar6[uVar27].bank_midi_msb;
              uVar26 = (ulong)uVar4 + local_2810;
              memset(&local_27b8.second,0,0x2780);
              local_27b8.first = uVar26;
              BasicBankMap<OPN2::Bank>::insert(&local_27d8,local_27f8,&local_27b8);
              puVar17 = ((local_27d8.first.slot)->value).second.ins[0].op[0].OPS[0].data + 6;
              lVar23 = 0;
              puVar20 = puVar22;
              do {
                pOVar1 = ((local_27d8.first.slot)->value).second.ins + lVar23;
                puVar3 = (undefined8 *)
                         ((long)&((local_27d8.first.slot)->value).second.ins[lVar23].op[1].
                                 noteOffset + 1);
                *puVar3 = 0;
                puVar3[1] = 0;
                pOVar13 = ((local_27d8.first.slot)->value).second.ins[lVar23].op;
                *(undefined8 *)(pOVar13[1].OPS[2].data + 2) = 0;
                *(undefined8 *)(pOVar13[1].OPS[3].data + 3) = 0;
                pOVar13 = ((local_27d8.first.slot)->value).second.ins[lVar23].op;
                pOVar13[1].OPS[0] = (uint8_t  [7])0x0;
                pOVar13[1].OPS[1].data[0] = '\0';
                *(undefined8 *)(pOVar13[1].OPS[1].data + 1) = 0;
                pOVar13 = ((local_27d8.first.slot)->value).second.ins[lVar23].op;
                *(undefined8 *)(pOVar13->OPS[2].data + 2) = 0;
                *(undefined8 *)(pOVar13->OPS[3].data + 3) = 0;
                pOVar2 = ((local_27d8.first.slot)->value).second.ins + lVar23;
                pOVar2->op[0].OPS[0] = (uint8_t  [7])0x0;
                pOVar2->op[0].OPS[1].data[0] = '\0';
                *(undefined8 *)(pOVar2->op[0].OPS[1].data + 1) = 0;
                ((local_27d8.first.slot)->value).second.ins[lVar23].drumTone =
                     pWVar6[uVar27].ins[lVar23].percussion_key_number;
                ((local_27d8.first.slot)->value).second.ins[lVar23].flags =
                     pWVar6[uVar27].ins[lVar23].inst_flags;
                ((local_27d8.first.slot)->value).second.ins[lVar23].op[0].fbalg =
                     pWVar6[uVar27].ins[lVar23].fbalg;
                ((local_27d8.first.slot)->value).second.ins[lVar23].op[0].lfosens =
                     pWVar6[uVar27].ins[lVar23].lfosens;
                ((local_27d8.first.slot)->value).second.ins[lVar23].op[0].noteOffset =
                     pWVar6[uVar27].ins[lVar23].note_offset;
                ((local_27d8.first.slot)->value).second.ins[lVar23].midiVelocityOffset =
                     pWVar6[uVar27].ins[lVar23].midi_velocity_offset;
                lVar25 = 0;
                do {
                  puVar17[lVar25 + -6] = puVar20[lVar25 + -6];
                  puVar17[lVar25 + -5] = puVar20[lVar25 + -5];
                  puVar17[lVar25 + -4] = puVar20[lVar25 + -4];
                  puVar17[lVar25 + -3] = puVar20[lVar25 + -3];
                  puVar17[lVar25 + -2] = puVar20[lVar25 + -2];
                  puVar17[lVar25 + -1] = puVar20[lVar25 + -1];
                  puVar17[lVar25] = puVar20[lVar25];
                  lVar25 = lVar25 + 7;
                } while (lVar25 != 0x1c);
                uVar21 = *(undefined8 *)pOVar1->op[0].OPS;
                uVar8 = *(undefined8 *)(pOVar1->op[0].OPS[1].data + 1);
                uVar9 = *(undefined8 *)(pOVar1->op[0].OPS[3].data + 3);
                *(undefined8 *)(pOVar1->op[1].OPS[2].data + 2) =
                     *(undefined8 *)(pOVar1->op[0].OPS[2].data + 2);
                *(undefined8 *)(pOVar1->op[1].OPS[3].data + 3) = uVar9;
                *(undefined8 *)pOVar1->op[1].OPS = uVar21;
                *(undefined8 *)(pOVar1->op[1].OPS[1].data + 1) = uVar8;
                uVar14 = pWVar6[uVar27].ins[lVar23].delay_off_ms;
                pOVar1->soundKeyOnMs = pWVar6[uVar27].ins[lVar23].delay_on_ms;
                pOVar1->soundKeyOffMs = uVar14;
                lVar23 = lVar23 + 1;
                puVar17 = puVar17 + 0x4f;
                puVar20 = puVar20 + 0x48;
              } while (lVar23 != 0x80);
              uVar27 = uVar27 + 1;
              puVar22 = puVar22 + 0x2424;
            } while (uVar27 != local_27f0);
          }
          local_2810 = 0x8000;
          ppWVar18 = &pWStack_27e0;
          uVar21 = 0;
          uVar15 = local_2818;
        } while ((local_2814 & 1) != 0);
        applySetup(local_2800);
        WOPN_Free(local_2808);
        return true;
      }
      switch(local_281c) {
      case 1:
        pcVar24 = "Custom bank: Invalid magic!";
        break;
      case 2:
        pcVar24 = "Custom bank: Unexpected ending!";
        break;
      case 3:
        pcVar24 = "Custom bank: Invalid banks count!";
        break;
      case 4:
        pcVar24 = "Custom bank: Version is newer than supported by this library!";
        break;
      case 5:
        pcVar24 = "Custom bank: Out of memory!";
        break;
      default:
        pcVar24 = "Custom bank: Unknown error!";
      }
      std::__cxx11::string::operator=((string *)&this->errorStringOut,pcVar24);
      return false;
    }
    pcVar24 = (char *)(this->errorStringOut)._M_string_length;
    pcVar19 = "Custom bank: Out of memory before of read!";
  }
  std::__cxx11::string::_M_replace((ulong)&this->errorStringOut,0,pcVar24,(ulong)pcVar19);
  return false;
}

Assistant:

bool OPNMIDIplay::LoadBank(FileAndMemReader &fr)
{
    int err = 0;
    WOPNFile *wopn = NULL;
    char *raw_file_data = NULL;
    size_t  fsize;
    if(!fr.isValid())
    {
        errorStringOut = "Custom bank: Invalid data stream!";
        return false;
    }

    // Read complete bank file into the memory
    fsize = fr.fileSize();
    fr.seek(0, FileAndMemReader::SET);
    // Allocate necessary memory block
    raw_file_data = (char*)malloc(fsize);
    if(!raw_file_data)
    {
        errorStringOut = "Custom bank: Out of memory before of read!";
        return false;
    }
    fr.read(raw_file_data, 1, fsize);

    // Parse bank file from the memory
    wopn = WOPN_LoadBankFromMem((void*)raw_file_data, fsize, &err);
    //Free the buffer no more needed
    free(raw_file_data);

    // Check for any erros
    if(!wopn)
    {
        switch(err)
        {
        case WOPN_ERR_BAD_MAGIC:
            errorStringOut = "Custom bank: Invalid magic!";
            return false;
        case WOPN_ERR_UNEXPECTED_ENDING:
            errorStringOut = "Custom bank: Unexpected ending!";
            return false;
        case WOPN_ERR_INVALID_BANKS_COUNT:
            errorStringOut = "Custom bank: Invalid banks count!";
            return false;
        case WOPN_ERR_NEWER_VERSION:
            errorStringOut = "Custom bank: Version is newer than supported by this library!";
            return false;
        case WOPN_ERR_OUT_OF_MEMORY:
            errorStringOut = "Custom bank: Out of memory!";
            return false;
        default:
            errorStringOut = "Custom bank: Unknown error!";
            return false;
        }
    }

    Synth &synth = *m_synth;
    synth.m_insBankSetup.volumeModel = wopn->volume_model;
    synth.m_insBankSetup.lfoEnable = (wopn->lfo_freq & 8) != 0;
    synth.m_insBankSetup.lfoFrequency = wopn->lfo_freq & 7;
    synth.m_insBankSetup.chipType = wopn->chip_type;
    // FIXME: Implement the bank-side flag to enable this
    synth.m_insBankSetup.mt32defaults = false;
    m_setup.VolumeModel = OPNMIDI_VolumeModel_AUTO;
    m_setup.lfoEnable = -1;
    m_setup.lfoFrequency = -1;
    m_setup.chipType = -1;

    synth.m_insBanks.clear();

    uint16_t slots_counts[2] = {wopn->banks_count_melodic, wopn->banks_count_percussion};
    WOPNBank *slots_src_ins[2] = { wopn->banks_melodic, wopn->banks_percussive };

    for(size_t ss = 0; ss < 2; ss++)
    {
        for(size_t i = 0; i < slots_counts[ss]; i++)
        {
            size_t bankno = (slots_src_ins[ss][i].bank_midi_msb * 256) +
                            (slots_src_ins[ss][i].bank_midi_lsb) +
                            (ss ? size_t(Synth::PercussionTag) : 0);
            Synth::Bank &bank = synth.m_insBanks[bankno];
            for(int j = 0; j < 128; j++)
            {
                OpnInstMeta &ins = bank.ins[j];
                std::memset(&ins, 0, sizeof(OpnInstMeta));
                WOPNInstrument &inIns = slots_src_ins[ss][i].ins[j];
                cvt_generic_to_FMIns(ins, inIns);
            }
        }
    }

    applySetup();

    WOPN_Free(wopn);

    return true;
}